

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int buffer_encrypt_record(ptls_buffer_t *buf,size_t rec_start,st_ptls_traffic_protection_t *enc)

{
  int iVar1;
  void *output;
  size_t delta;
  size_t sVar2;
  void *__dest;
  st_ptls_traffic_protection_t *in_RDX;
  long in_RSI;
  st_ptls_traffic_protection_t *in_RDI;
  size_t encrypted_len;
  size_t overhead;
  int ret;
  uint8_t type;
  uint8_t *tmpbuf;
  size_t bodylen;
  undefined4 in_stack_ffffffffffffffc8;
  undefined3 in_stack_ffffffffffffffcc;
  uint uVar3;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  output = (void *)((*(long *)(in_RDI->secret + 0x10) - in_RSI) - 5);
  uVar3 = CONCAT13(*(undefined1 *)(*(long *)in_RDI->secret + in_RSI),in_stack_ffffffffffffffcc);
  if (output < (void *)0x4001) {
    delta = in_RDX->aead->algo->tag_size + 1;
    iVar1 = ptls_buffer_reserve((ptls_buffer_t *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),delta);
    if (iVar1 == 0) {
      sVar2 = aead_encrypt(in_RDX,output,in_stack_ffffffffffffffd0,(ulong)uVar3 << 0x20,
                           (uint8_t)(delta >> 0x38));
      if (sVar2 != (long)output + delta) {
        __assert_fail("encrypted_len == bodylen + overhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                      ,0x2c2,
                      "int buffer_encrypt_record(ptls_buffer_t *, size_t, struct st_ptls_traffic_protection_t *)"
                     );
      }
      *(size_t *)(in_RDI->secret + 0x10) = delta + *(long *)(in_RDI->secret + 0x10);
      *(undefined1 *)(*(long *)in_RDI->secret + in_RSI) = 0x17;
      *(char *)(*(long *)in_RDI->secret + 3 + in_RSI) = (char)(sVar2 >> 8);
      *(char *)(*(long *)in_RDI->secret + 4 + in_RSI) = (char)sVar2;
      iVar1 = 0;
    }
  }
  else {
    __dest = malloc((size_t)output);
    if (__dest == (void *)0x0) {
      iVar1 = 0x201;
    }
    else {
      memcpy(__dest,(void *)(*(long *)in_RDI->secret + in_RSI + 5),(size_t)output);
      (*ptls_clear_memory)((void *)(*(long *)in_RDI->secret + in_RSI),(long)output + 5);
      *(long *)(in_RDI->secret + 0x10) = in_RSI;
      iVar1 = buffer_push_encrypted_records
                        (_ret,overhead._7_1_,(uint8_t *)encrypted_len,
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    }
    if (__dest != (void *)0x0) {
      (*ptls_clear_memory)(__dest,(size_t)output);
      free(__dest);
    }
  }
  return iVar1;
}

Assistant:

static int buffer_encrypt_record(ptls_buffer_t *buf, size_t rec_start, struct st_ptls_traffic_protection_t *enc)
{
    size_t bodylen = buf->off - rec_start - 5;
    uint8_t *tmpbuf, type = buf->base[rec_start];
    int ret;

    /* fast path: do in-place encryption if only one record needs to be emitted */
    if (bodylen <= PTLS_MAX_PLAINTEXT_RECORD_SIZE) {
        size_t overhead = 1 + enc->aead->algo->tag_size;
        if ((ret = ptls_buffer_reserve(buf, overhead)) != 0)
            return ret;
        size_t encrypted_len = aead_encrypt(enc, buf->base + rec_start + 5, buf->base + rec_start + 5, bodylen, type);
        assert(encrypted_len == bodylen + overhead);
        buf->off += overhead;
        buf->base[rec_start] = PTLS_CONTENT_TYPE_APPDATA;
        buf->base[rec_start + 3] = (encrypted_len >> 8) & 0xff;
        buf->base[rec_start + 4] = encrypted_len & 0xff;
        return 0;
    }

    /* move plaintext to temporary buffer */
    if ((tmpbuf = malloc(bodylen)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(tmpbuf, buf->base + rec_start + 5, bodylen);
    ptls_clear_memory(buf->base + rec_start, bodylen + 5);
    buf->off = rec_start;

    /* push encrypted records */
    ret = buffer_push_encrypted_records(buf, type, tmpbuf, bodylen, enc);

Exit:
    if (tmpbuf != NULL) {
        ptls_clear_memory(tmpbuf, bodylen);
        free(tmpbuf);
    }
    return ret;
}